

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_list.cpp
# Opt level: O2

double __thiscall ExprEval::Engine::NodeList::calculate(NodeList *this,size_t index)

{
  NodeType NVar1;
  pointer pNVar2;
  double local_a0;
  Node node;
  Expression subexpr;
  
  this->m_beg = index;
  this->m_end = index + 1;
  local_a0 = calc(this,index,0);
  NVar1 = (this->m_cache).type;
  pNVar2 = (this->m_nodes).
           super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::erase
            (&this->m_nodes,pNVar2 + this->m_beg,pNVar2 + this->m_end);
  if (NVar1 == Expression) {
    (this->m_cache).type = Empty;
    subexpr.m_expression._M_dataplus._M_p = (pointer)&subexpr.m_expression.field_2;
    subexpr.m_expression._M_string_length = 0;
    subexpr.m_expression.field_2._M_local_buf[0] = '\0';
    subexpr.is_calculated = false;
    local_a0 = Expression::evaluate(&subexpr,&(this->m_cache).expression);
    node.symbol._M_dataplus._M_p = (pointer)&node.symbol.field_2;
    node.symbol._M_string_length = 0;
    node.symbol.field_2._M_local_buf[0] = '\0';
    node.expression._M_dataplus._M_p = (pointer)&node.expression.field_2;
    node.expression._M_string_length = 0;
    node.expression.field_2._M_local_buf[0] = '\0';
    node.type = Number;
    node.number = local_a0;
    std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::insert
              (&this->m_nodes,
               (this->m_nodes).
               super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
               _M_impl.super__Vector_impl_data._M_start + this->m_beg,&node);
    Node::~Node(&node);
    std::__cxx11::string::~string((string *)&subexpr);
  }
  else {
    node.symbol._M_dataplus._M_p = (pointer)&node.symbol.field_2;
    node.symbol._M_string_length = 0;
    node.symbol.field_2._M_local_buf[0] = '\0';
    node.expression._M_dataplus._M_p = (pointer)&node.expression.field_2;
    node.expression._M_string_length = 0;
    node.expression.field_2._M_local_buf[0] = '\0';
    node.type = Number;
    node.number = local_a0;
    std::vector<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>::insert
              (&this->m_nodes,
               (this->m_nodes).
               super__Vector_base<ExprEval::Engine::Node,_std::allocator<ExprEval::Engine::Node>_>.
               _M_impl.super__Vector_impl_data._M_start + this->m_beg,&node);
    Node::~Node(&node);
  }
  return local_a0;
}

Assistant:

double NodeList::calculate(size_t index){
            // std::cout<<"Index: "<<index<<'\n';
            m_beg = index;
            m_end = index + 1;

            double ans;
            try
            {
                ans = calc(index);
            }
            catch(const Exception& e)
            {
                // std::cerr << e.what() << '\n';
                throw e;
            }
            // std::cout<<"beg: "<<m_beg<<", end: "<<m_end<<'\n';
            if(m_cache.type == NodeType::Expression){
                // std::cout<<"replacing with "<<m_cache.expression<<'\n';
                // std::cout<<" from ["<<m_beg<<", "<<m_end<<"), size: "<<m_nodes.size()<<'\n';
                m_nodes.erase(m_nodes.begin()+m_beg, m_nodes.begin()+m_end);
                m_cache.type = NodeType::Empty;

                ExprEval::Expression subexpr;
                ans = subexpr.evaluate(m_cache.expression);

                Node node;
                node.set(ans);
                m_nodes.insert(m_nodes.begin()+m_beg, node);
                // std::cout<<"replacing with the number: "<<ans<<'\n';
            } else{
                m_nodes.erase(m_nodes.begin()+m_beg, m_nodes.begin()+m_end);
                
                Node node;
                node.set(ans);
                m_nodes.insert(m_nodes.begin()+m_beg, node);
            }
            // std::cout<<"final ans: "<<ans<<'\n';
            return ans;
        }